

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O0

bool Cipher::subbreak1(TParameters *params,TFreqMap *freqMap,TResult *result)

{
  _Base_ptr *pp_Var1;
  size_type sVar2;
  const_reference pvVar3;
  mapped_type_conflict *pmVar4;
  int iVar5;
  _Base_ptr in_RDX;
  size_t in_RDI;
  TProb TVar6;
  TProb curp;
  int a1_1;
  int a0_1;
  int i_2;
  TClusterToLetterMap cura;
  TProb iterp;
  int a1;
  int a0;
  int i_1;
  int nswaps;
  TClusterToLetterMap itera;
  int nMainIters;
  int nIters;
  float bestp;
  int i;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> fixed;
  TClusterToLetterMap besta;
  TProb *minBestP;
  TClusterToLetterMap *clMap;
  TClusters *clusters;
  float letterFreqCost;
  int nLetters;
  TClusterPos clusterPos;
  TClusterCount clusterCount;
  TLetterCount letterCount;
  TPlainText plainText;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffe18;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar7;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffe20;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe30;
  float letFreqCost;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  _Base_ptr in_stack_fffffffffffffe88;
  _Base_ptr in_stack_fffffffffffffe90;
  TPlainText *in_stack_fffffffffffffe98;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  TClusters *in_stack_fffffffffffffeb8;
  TParameters *in_stack_fffffffffffffec0;
  _Base_ptr in_stack_fffffffffffffec8;
  _Base_ptr in_stack_fffffffffffffed0;
  _Base_ptr in_stack_fffffffffffffed8;
  TLetterCount *in_stack_fffffffffffffee0;
  int iVar8;
  int iVar9;
  float local_110;
  float local_10c;
  undefined1 local_80 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> local_78;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> local_30;
  
  local_30._M_t._M_impl.super__Rb_tree_header._M_header._M_left = in_RDX;
  local_30._M_t._M_impl.super__Rb_tree_header._M_node_count = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1ac1ac);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1ac1b9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1ac1c6);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x1ac1d3);
  local_80._4_4_ = 0;
  local_80._0_4_ = 0;
  pp_Var1 = &(local_30._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->_M_parent;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  getRandomCLMap(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (TClusterToLetterMap *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::map
            ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             0x1ac268);
  local_10c = 0.0;
  while (letFreqCost = local_10c,
        sVar2 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           (local_30._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x60)),
        (int)letFreqCost < (int)sVar2) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        (local_30._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x60),
                        (long)(int)local_10c);
    if (-1 < *pvVar3) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)
                 (local_30._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2),
                 (long)(int)local_10c);
      pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                           *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          (key_type_conflict *)in_stack_fffffffffffffe58);
      *pmVar4 = true;
    }
    local_10c = (float)((int)local_10c + 1);
  }
  this = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
         (local_80 + 4);
  pmVar7 = &local_78;
  anon_unknown.dwarf_3bf68::calcHelpers
            ((TParameters *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (TClusterToLetterMap *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (TLetterCount *)in_stack_fffffffffffffe90,(TClusterCount *)in_stack_fffffffffffffe88,
             (TClusterPos *)in_stack_fffffffffffffec0,(int *)in_stack_fffffffffffffec8,
             (float *)in_stack_fffffffffffffed0);
  TVar6 = calcScore1((TParameters *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     (TFreqMap *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe58,letFreqCost);
  local_110 = (float)TVar6;
  iVar9 = 0;
  iVar8 = *(int *)(local_30._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x1c);
  while (iVar5 = iVar8 + -1, iVar8 != 0) {
    iVar9 = iVar9 + 1;
    iVar8 = iVar5;
    if (100 < iVar9) {
      getRandomCLMap(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     (TClusterToLetterMap *)
                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      this = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             (local_80 + 4);
      pmVar7 = &local_78;
      anon_unknown.dwarf_3bf68::calcHelpers
                ((TParameters *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (TClusterToLetterMap *)
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (TLetterCount *)in_stack_fffffffffffffe90,
                 (TClusterCount *)in_stack_fffffffffffffe88,(TClusterPos *)in_stack_fffffffffffffec0
                 ,(int *)in_stack_fffffffffffffec8,(float *)in_stack_fffffffffffffed0);
      TVar6 = calcScore1((TParameters *)
                         CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (TFreqMap *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe58,letFreqCost);
      local_110 = (float)TVar6;
      iVar9 = 0;
      iVar8 = iVar5;
    }
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              (this,pmVar7);
    in_stack_fffffffffffffeb4 = 3;
    for (in_stack_fffffffffffffeb0 = 0; in_stack_fffffffffffffeb0 < in_stack_fffffffffffffeb4;
        in_stack_fffffffffffffeb0 = in_stack_fffffffffffffeb0 + 1) {
      in_stack_fffffffffffffeac = rand();
      in_stack_fffffffffffffeac =
           in_stack_fffffffffffffeac %
           *(int *)(local_30._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
      in_stack_fffffffffffffea8 = rand();
      for (in_stack_fffffffffffffea8 =
                in_stack_fffffffffffffea8 %
                *(int *)(local_30._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
          in_stack_fffffffffffffeac == in_stack_fffffffffffffea8;
          in_stack_fffffffffffffea8 =
               in_stack_fffffffffffffea8 %
               *(int *)(local_30._M_t._M_impl.super__Rb_tree_header._M_node_count + 4)) {
        in_stack_fffffffffffffeac = rand();
        in_stack_fffffffffffffeac =
             in_stack_fffffffffffffeac %
             *(int *)(local_30._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
        in_stack_fffffffffffffea8 = rand();
      }
      pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
               operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                           *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          (key_type_conflict *)in_stack_fffffffffffffe58);
      if (((*pmVar4 & 1U) == 0) &&
         (pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                   ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                                (key_type_conflict *)in_stack_fffffffffffffe58), (*pmVar4 & 1U) == 0
         )) {
        in_stack_fffffffffffffe30 = (vector<int,_std::allocator<int>_> *)local_80;
        this = &local_30;
        pmVar7 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &stack0xfffffffffffffeb8;
        anon_unknown.dwarf_3bf68::updateHelpers
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (TClusterPos *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
                   (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                   (TClusterToLetterMap *)in_stack_fffffffffffffed0,
                   (TPlainText *)in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
                   (float *)CONCAT44(iVar9,iVar8));
      }
    }
    in_stack_fffffffffffffea0 =
         (vector<int,_std::allocator<int>_> *)
         calcScore1((TParameters *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                    (TFreqMap *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                    in_stack_fffffffffffffe58,letFreqCost);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              (this,pmVar7);
    for (in_stack_fffffffffffffe6c = 0; in_stack_fffffffffffffe6c < 10;
        in_stack_fffffffffffffe6c = in_stack_fffffffffffffe6c + 1) {
      in_stack_fffffffffffffe68 = rand();
      in_stack_fffffffffffffe68 =
           in_stack_fffffffffffffe68 %
           *(int *)(local_30._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
      in_stack_fffffffffffffe64 = rand();
      for (in_stack_fffffffffffffe64 =
                in_stack_fffffffffffffe64 %
                *(int *)(local_30._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
          in_stack_fffffffffffffe68 == in_stack_fffffffffffffe64;
          in_stack_fffffffffffffe64 =
               in_stack_fffffffffffffe64 %
               *(int *)(local_30._M_t._M_impl.super__Rb_tree_header._M_node_count + 4)) {
        in_stack_fffffffffffffe68 = rand();
        in_stack_fffffffffffffe68 =
             in_stack_fffffffffffffe68 %
             *(int *)(local_30._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
        in_stack_fffffffffffffe64 = rand();
      }
      in_stack_fffffffffffffe30 = (vector<int,_std::allocator<int>_> *)local_80;
      this = &local_30;
      pmVar7 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &stack0xfffffffffffffe70;
      anon_unknown.dwarf_3bf68::updateHelpers
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (TClusterPos *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
                 (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                 (TClusterToLetterMap *)in_stack_fffffffffffffed0,
                 (TPlainText *)in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
                 (float *)CONCAT44(iVar9,iVar8));
      in_stack_fffffffffffffe58 =
           (vector<int,_std::allocator<int>_> *)
           calcScore1((TParameters *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                      (TFreqMap *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      in_stack_fffffffffffffe58,letFreqCost);
      if ((double)in_stack_fffffffffffffe58 <= (double)in_stack_fffffffffffffea0) {
        in_stack_fffffffffffffe30 = (vector<int,_std::allocator<int>_> *)local_80;
        this = &local_30;
        pmVar7 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &stack0xfffffffffffffe70;
        anon_unknown.dwarf_3bf68::updateHelpers
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (TClusterPos *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,
                   (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                   (TClusterToLetterMap *)in_stack_fffffffffffffed0,
                   (TPlainText *)in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
                   (float *)CONCAT44(iVar9,iVar8));
      }
      else {
        in_stack_fffffffffffffea0 = in_stack_fffffffffffffe58;
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator=
                  (this,pmVar7);
        in_stack_fffffffffffffe6c = 0;
      }
    }
    if ((double)local_110 < (double)in_stack_fffffffffffffea0) {
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator=
                (this,pmVar7);
      local_110 = (float)(double)in_stack_fffffffffffffea0;
      if ((double)*pp_Var1 <= (double)local_110 && (double)local_110 != (double)*pp_Var1) {
        *pp_Var1 = (_Base_ptr)(double)local_110;
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator=
                  (this,pmVar7);
      }
      iVar9 = 0;
    }
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               0x1ac956);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               0x1ac963);
  }
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::~map
            ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             0x1ac984);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x1ac991)
  ;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_stack_fffffffffffffe30);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe30);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe30);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe30);
  return true;
}

Assistant:

bool subbreak1(
        const TParameters & params,
        const TFreqMap & freqMap,
        TResult & result) {

        // helpers
        TPlainText plainText;
        TLetterCount letterCount;
        TClusterCount clusterCount;
        TClusterPos clusterPos;

        int nLetters = 0;
        float letterFreqCost = 0.0f;

        const auto & clusters = result.clusters;
        auto & clMap = result.clMap;
        auto & minBestP = result.p;

        auto besta = clMap;
        getRandomCLMap(params, clusters, besta);

        std::map<TLetter, bool> fixed;
        for (int i = 0; i < (int) params.hint.size(); ++i) {
            if (params.hint[i] < 0) continue;
            fixed[clusters[i]] = true;
        }

        ::calcHelpers(params, besta, clusters, plainText, letterCount, clusterCount, clusterPos, nLetters, letterFreqCost);
        float bestp = calcScore1(params, freqMap, plainText, letterFreqCost);

        int nIters = 0;
        int nMainIters = params.nSubbreakIterations;
        while (nMainIters--) {
            if (++nIters > 100) {
                getRandomCLMap(params, clusters, besta);

                ::calcHelpers(params, besta, clusters, plainText, letterCount, clusterCount, clusterPos, nLetters, letterFreqCost);
                bestp = calcScore1(params, freqMap, plainText, letterFreqCost);

                nIters = 0;
            }

            auto itera = besta;

            int nswaps = 3;
            for (int i = 0; i < nswaps; ++i) {
                int a0 = rand()%params.maxClusters;
                int a1 = rand()%params.maxClusters;
                while (a0 == a1) {
                    a0 = rand()%params.maxClusters;
                    a1 = rand()%params.maxClusters;
                }

                if (fixed[a0] || fixed[a1]) {
                } else {
                    //std::swap(itera[a0], itera[a1]);
                    ::updateHelpers(params, clusterCount, clusterPos, nLetters, a0, a1, itera, plainText, letterCount, letterFreqCost);
                }
            }

            auto iterp = calcScore1(params, freqMap, plainText, letterFreqCost);

            auto cura = itera;
            for (int i = 0; i < 10; ++i) {
                int a0 = rand()%params.maxClusters;
                int a1 = rand()%params.maxClusters;
                while (a0 == a1) {
                    a0 = rand()%params.maxClusters;
                    a1 = rand()%params.maxClusters;
                }

                //std::swap(cura[a0], cura[a1]);
                ::updateHelpers(params, clusterCount, clusterPos, nLetters, a0, a1, cura, plainText, letterCount, letterFreqCost);
                auto curp = calcScore1(params, freqMap, plainText, letterFreqCost);

                if (curp > iterp) {
                    iterp = curp;
                    itera = cura;
                    i = 0;
                } else {
					//std::swap(cura[a0], cura[a1]);
                    ::updateHelpers(params, clusterCount, clusterPos, nLetters, a0, a1, cura, plainText, letterCount, letterFreqCost);
                }
            }

            if (iterp > bestp) {
                besta = itera;
                bestp = iterp;

                if (bestp > minBestP) {
                    minBestP = bestp;
                    clMap = besta;
                }
                nIters = 0;
            }
        }

        return true;
    }